

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::PopColumnsBackground(void)

{
  ImGuiOldColumns *pIVar1;
  ImGuiWindow *window_00;
  ImGuiOldColumns *columns;
  ImGuiWindow *window;
  
  window_00 = GetCurrentWindowRead();
  pIVar1 = (window_00->DC).CurrentColumns;
  if (pIVar1->Count != 1) {
    SetWindowClipRectBeforeSetChannel(window_00,&pIVar1->HostBackupClipRect);
    ImDrawListSplitter::SetCurrentChannel(&pIVar1->Splitter,window_00->DrawList,pIVar1->Current + 1)
    ;
  }
  return;
}

Assistant:

void ImGui::PopColumnsBackground()
{
    ImGuiWindow* window = GetCurrentWindowRead();
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    if (columns->Count == 1)
        return;

    // Optimization: avoid PopClipRect() + SetCurrentChannel()
    SetWindowClipRectBeforeSetChannel(window, columns->HostBackupClipRect);
    columns->Splitter.SetCurrentChannel(window->DrawList, columns->Current + 1);
}